

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

ConvexH * ConvexDecomposition::ConvexHMakeCube(float3 *bmin,float3 *bmax)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  float3 *pfVar4;
  Plane *pPVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ConvexH *pCVar8;
  char *__function;
  undefined1 auVar9 [16];
  
  pCVar8 = test_cube();
  if (0 < (pCVar8->vertices).count) {
    fVar1 = bmin->z;
    fVar2 = bmin->y;
    pfVar4 = (pCVar8->vertices).element;
    pfVar4->x = bmin->x;
    pfVar4->y = fVar2;
    pfVar4->z = fVar1;
    if (1 < (pCVar8->vertices).count) {
      fVar1 = bmax->z;
      fVar2 = bmin->y;
      pfVar4[1].x = bmin->x;
      pfVar4[1].y = fVar2;
      pfVar4[1].z = fVar1;
      if (2 < (pCVar8->vertices).count) {
        fVar1 = bmin->z;
        fVar2 = bmax->y;
        pfVar4[2].x = bmin->x;
        pfVar4[2].y = fVar2;
        pfVar4[2].z = fVar1;
        if (3 < (pCVar8->vertices).count) {
          fVar1 = bmax->y;
          fVar2 = bmax->z;
          pfVar4[3].x = bmin->x;
          pfVar4[3].y = fVar1;
          pfVar4[3].z = fVar2;
          if (4 < (pCVar8->vertices).count) {
            fVar1 = bmin->y;
            fVar2 = bmin->z;
            pfVar4[4].x = bmax->x;
            pfVar4[4].y = fVar1;
            pfVar4[4].z = fVar2;
            if (5 < (pCVar8->vertices).count) {
              fVar1 = bmax->z;
              fVar2 = bmin->y;
              pfVar4[5].x = bmax->x;
              pfVar4[5].y = fVar2;
              pfVar4[5].z = fVar1;
              if (6 < (pCVar8->vertices).count) {
                fVar1 = bmin->z;
                fVar2 = bmax->y;
                pfVar4[6].x = bmax->x;
                pfVar4[6].y = fVar2;
                pfVar4[6].z = fVar1;
                if (7 < (pCVar8->vertices).count) {
                  fVar1 = bmax->z;
                  fVar2 = bmax->y;
                  pfVar4[7].x = bmax->x;
                  pfVar4[7].y = fVar2;
                  pfVar4[7].z = fVar1;
                  if (0 < (pCVar8->facets).count) {
                    fVar1 = bmin->x;
                    pPVar5 = (pCVar8->facets).element;
                    uVar3 = vmovlps_avx(SUB6416(ZEXT464(0xbf800000),0));
                    (pPVar5->normal).x = (float)(int)uVar3;
                    (pPVar5->normal).y = (float)(int)((ulong)uVar3 >> 0x20);
                    (pPVar5->normal).z = 0.0;
                    pPVar5->dist = fVar1;
                    if (1 < (pCVar8->facets).count) {
                      auVar9._8_4_ = 0x80000000;
                      auVar9._0_8_ = 0x8000000080000000;
                      auVar9._12_4_ = 0x80000000;
                      auVar9 = vxorps_avx512vl(ZEXT416((uint)bmax->x),auVar9);
                      uVar3 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
                      pPVar5[1].normal.x = (float)(int)uVar3;
                      pPVar5[1].normal.y = (float)(int)((ulong)uVar3 >> 0x20);
                      pPVar5[1].normal.z = 0.0;
                      pPVar5[1].dist = auVar9._0_4_;
                      if (2 < (pCVar8->facets).count) {
                        fVar1 = bmin->y;
                        pPVar5[2].normal.x = 0.0;
                        pPVar5[2].normal.y = -1.0;
                        pPVar5[2].normal.z = 0.0;
                        pPVar5[2].dist = fVar1;
                        if (3 < (pCVar8->facets).count) {
                          auVar6._8_4_ = 0x80000000;
                          auVar6._0_8_ = 0x8000000080000000;
                          auVar6._12_4_ = 0x80000000;
                          auVar9 = vxorps_avx512vl(ZEXT416((uint)bmax->y),auVar6);
                          pPVar5[3].normal.x = 0.0;
                          pPVar5[3].normal.y = 1.0;
                          pPVar5[3].normal.z = 0.0;
                          pPVar5[3].dist = auVar9._0_4_;
                          if (4 < (pCVar8->facets).count) {
                            fVar1 = bmin->z;
                            pPVar5[4].normal.x = 0.0;
                            pPVar5[4].normal.y = 0.0;
                            pPVar5[4].normal.z = -1.0;
                            pPVar5[4].dist = fVar1;
                            if (5 < (pCVar8->facets).count) {
                              fVar1 = bmax->z;
                              pPVar5[5].normal.x = 0.0;
                              pPVar5[5].normal.y = 0.0;
                              pPVar5[5].normal.z = 1.0;
                              auVar7._8_4_ = 0x80000000;
                              auVar7._0_8_ = 0x8000000080000000;
                              auVar7._12_4_ = 0x80000000;
                              auVar9 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar7);
                              pPVar5[5].dist = auVar9._0_4_;
                              return pCVar8;
                            }
                          }
                        }
                      }
                    }
                  }
                  __function = 
                  "Type &ConvexDecomposition::Array<ConvexDecomposition::Plane>::operator[](int) [Type = ConvexDecomposition::Plane]"
                  ;
                  goto LAB_0090529c;
                }
              }
            }
          }
        }
      }
    }
  }
  __function = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::float3>::operator[](int) [Type = ConvexDecomposition::float3]"
  ;
LAB_0090529c:
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,__function);
}

Assistant:

ConvexH *ConvexHMakeCube(const REAL3 &bmin, const REAL3 &bmax) {
	ConvexH *convex = test_cube();
	convex->vertices[0] = REAL3(bmin.x,bmin.y,bmin.z);
	convex->vertices[1] = REAL3(bmin.x,bmin.y,bmax.z);
	convex->vertices[2] = REAL3(bmin.x,bmax.y,bmin.z);
	convex->vertices[3] = REAL3(bmin.x,bmax.y,bmax.z);
	convex->vertices[4] = REAL3(bmax.x,bmin.y,bmin.z);
	convex->vertices[5] = REAL3(bmax.x,bmin.y,bmax.z);
	convex->vertices[6] = REAL3(bmax.x,bmax.y,bmin.z);
	convex->vertices[7] = REAL3(bmax.x,bmax.y,bmax.z);

	convex->facets[0] = Plane(REAL3(-1,0,0), bmin.x);
	convex->facets[1] = Plane(REAL3(1,0,0), -bmax.x);
	convex->facets[2] = Plane(REAL3(0,-1,0), bmin.y);
	convex->facets[3] = Plane(REAL3(0,1,0), -bmax.y);
	convex->facets[4] = Plane(REAL3(0,0,-1), bmin.z);
	convex->facets[5] = Plane(REAL3(0,0,1), -bmax.z);
	return convex;
}